

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_133c8f4::QChildProcess::~QChildProcess(QChildProcess *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  cleanup(this,in_RSI);
  CharPointerList::~CharPointerList(&this->envp);
  CharPointerList::~CharPointerList(&this->argv);
  return;
}

Assistant:

~QChildProcess() noexcept(false)
    {
        cleanup();
    }